

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktComputeIndirectComputeDispatchTests.cpp
# Opt level: O0

DispatchCommandsVec *
vkt::compute::anon_unknown_1::commandsVec
          (DispatchCommandsVec *__return_storage_ptr__,DispatchCommand *cmd0,DispatchCommand *cmd1,
          DispatchCommand *cmd2,DispatchCommand *cmd3,DispatchCommand *cmd4)

{
  DispatchCommand *cmd4_local;
  DispatchCommand *cmd3_local;
  DispatchCommand *cmd2_local;
  DispatchCommand *cmd1_local;
  DispatchCommand *cmd0_local;
  DispatchCommandsVec *vec;
  
  std::
  vector<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
  ::vector(__return_storage_ptr__);
  std::
  vector<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
  ::push_back(__return_storage_ptr__,cmd0);
  std::
  vector<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
  ::push_back(__return_storage_ptr__,cmd1);
  std::
  vector<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
  ::push_back(__return_storage_ptr__,cmd2);
  std::
  vector<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
  ::push_back(__return_storage_ptr__,cmd3);
  std::
  vector<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
  ::push_back(__return_storage_ptr__,cmd4);
  return __return_storage_ptr__;
}

Assistant:

DispatchCommandsVec commandsVec (const DispatchCommand& cmd0,
								 const DispatchCommand& cmd1,
								 const DispatchCommand& cmd2,
								 const DispatchCommand& cmd3,
								 const DispatchCommand& cmd4)
{
	DispatchCommandsVec vec;
	vec.push_back(cmd0);
	vec.push_back(cmd1);
	vec.push_back(cmd2);
	vec.push_back(cmd3);
	vec.push_back(cmd4);
	return vec;
}